

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  opj_jp2_cmap_comp_t *poVar1;
  opj_image_comp_t *poVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  opj_jp2_pclr_t *poVar6;
  opj_image_comp_t *ptr;
  opj_jp2_cmap_comp_t *poVar7;
  OPJ_BYTE *pOVar8;
  OPJ_UINT32 *pOVar9;
  OPJ_BYTE *pOVar10;
  OPJ_INT32 *pOVar11;
  OPJ_INT32 *pOVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  OPJ_UINT32 OVar23;
  opj_image_comp_t *ptr_00;
  void *pvVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ushort uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  
  poVar6 = color->jp2_pclr;
  bVar3 = poVar6->nr_channels;
  ptr = image->comps;
  if (bVar3 != 0) {
    poVar7 = poVar6->cmap;
    uVar25 = 0;
    if (ptr[poVar7->cmp].data != (OPJ_INT32 *)0x0) {
      pOVar8 = poVar6->channel_size;
      pOVar9 = poVar6->entries;
      pOVar10 = poVar6->channel_sign;
      lVar26 = 1;
      do {
        if ((ushort)bVar3 <= (ushort)lVar26) {
          ptr_00 = (opj_image_comp_t *)opj_malloc((ulong)bVar3 << 6);
          if (ptr_00 == (opj_image_comp_t *)0x0) goto LAB_0011cf4a;
          if (bVar3 == 0) goto LAB_0011cd1c;
          lVar26 = 0x30;
          uVar25 = 0;
          goto LAB_0011cd9a;
        }
        poVar1 = poVar7 + lVar26;
        lVar26 = lVar26 + 1;
      } while (ptr[poVar1->cmp].data != (OPJ_INT32 *)0x0);
      uVar25 = (ulong)((int)lVar26 - 1);
    }
    opj_event_msg(p_manager,1,"image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n",uVar25);
    return 0;
  }
  ptr_00 = (opj_image_comp_t *)opj_malloc(0);
  if (ptr_00 == (opj_image_comp_t *)0x0) {
LAB_0011cf4a:
    opj_event_msg(p_manager,1,"Memory allocation failure in opj_jp2_apply_pclr().\n");
    return 0;
  }
LAB_0011cd1c:
  uVar30 = image->numcomps;
  if (uVar30 != 0) {
    uVar29 = 0;
    do {
      if (ptr[uVar29].data != (OPJ_INT32 *)0x0) {
        opj_image_data_free(ptr[uVar29].data);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < uVar30);
  }
  opj_free(ptr);
  image->comps = ptr_00;
  image->numcomps = (uint)bVar3;
  return 1;
  while( true ) {
    *(uint *)((long)ptr_00 + lVar26 + -0x18) = (uint)pOVar8[uVar25];
    *(uint *)((long)ptr_00 + lVar26 + -0x10) = (uint)pOVar10[uVar25];
    uVar25 = uVar25 + 1;
    lVar26 = lVar26 + 0x40;
    if (bVar3 == uVar25) break;
LAB_0011cd9a:
    uVar27 = (ulong)poVar7[uVar25].pcol;
    uVar29 = poVar7[uVar25].cmp;
    if (poVar7[uVar25].mtyp == '\0') {
      uVar28 = uVar25;
      if (uVar27 != 0) {
        __assert_fail("pcol == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                      ,0x431,
                      "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                     );
      }
    }
    else {
      uVar28 = uVar27;
      if (uVar25 != uVar27) {
        __assert_fail("i == pcol",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                      ,0x434,
                      "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                     );
      }
    }
    poVar2 = ptr + uVar29;
    OVar20 = poVar2->dx;
    OVar21 = poVar2->dy;
    OVar22 = poVar2->w;
    OVar23 = poVar2->h;
    poVar2 = ptr + uVar29;
    OVar18 = poVar2->x0;
    OVar19 = poVar2->y0;
    uVar13 = *(undefined8 *)(&poVar2->x0 + 2);
    poVar2 = ptr + uVar29;
    OVar16 = poVar2->sgnd;
    OVar17 = poVar2->resno_decoded;
    uVar14 = *(undefined8 *)(&poVar2->sgnd + 2);
    uVar15 = (&ptr[uVar29].data)[1];
    ptr_00[uVar28].data = ptr[uVar29].data;
    (&ptr_00[uVar28].data)[1] = (OPJ_INT32 *)uVar15;
    poVar2 = ptr_00 + uVar28;
    poVar2->sgnd = OVar16;
    poVar2->resno_decoded = OVar17;
    *(undefined8 *)(&poVar2->sgnd + 2) = uVar14;
    poVar2 = ptr_00 + uVar28;
    poVar2->x0 = OVar18;
    poVar2->y0 = OVar19;
    *(undefined8 *)(&poVar2->x0 + 2) = uVar13;
    poVar2 = ptr_00 + uVar28;
    poVar2->dx = OVar20;
    poVar2->dy = OVar21;
    poVar2->w = OVar22;
    poVar2->h = OVar23;
    pvVar24 = opj_image_data_alloc((ulong)ptr[uVar29].h * (ulong)ptr[uVar29].w * 4);
    *(void **)((long)&ptr_00->dx + lVar26) = pvVar24;
    if (pvVar24 == (void *)0x0) {
      if (uVar25 != 0) {
        lVar26 = lVar26 + -0x30;
        do {
          opj_image_data_free(*(void **)((long)ptr_00 + lVar26 + -0x10));
          lVar26 = lVar26 + -0x40;
        } while (lVar26 != 0);
      }
      opj_free(ptr_00);
      goto LAB_0011cf4a;
    }
  }
  if ((ulong)bVar3 != 0) {
    uVar29 = color->jp2_pclr->nr_entries;
    uVar25 = 0;
    do {
      pOVar11 = ptr[poVar7[uVar25].cmp].data;
      if (pOVar11 == (OPJ_INT32 *)0x0) {
        __assert_fail("src",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                      ,0x450,
                      "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                     );
      }
      bVar4 = poVar7[uVar25].pcol;
      uVar31 = ptr_00[bVar4].h * ptr_00[bVar4].w;
      uVar30 = (uint)uVar25;
      if (poVar7[uVar25].mtyp == '\0') {
        lVar26 = *(long *)((long)&ptr_00->data + (ulong)(uVar30 << 6));
        if (lVar26 == 0) {
          __assert_fail("dst",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x456,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        if (uVar31 != 0) {
          uVar25 = 0;
          do {
            *(OPJ_INT32 *)(lVar26 + uVar25 * 4) = pOVar11[uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar31 != uVar25);
        }
      }
      else {
        if (uVar30 != bVar4) {
          __assert_fail("i == pcol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x45b,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        pOVar12 = ptr_00[bVar4].data;
        if (pOVar12 == (OPJ_INT32 *)0x0) {
          __assert_fail("dst",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x45d,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        if (uVar31 != 0) {
          uVar25 = 0;
          do {
            iVar5 = pOVar11[uVar25];
            iVar32 = uVar29 - 1;
            if (iVar5 < (int)(uint)uVar29) {
              iVar32 = iVar5;
            }
            if (iVar5 < 0) {
              iVar32 = 0;
            }
            pOVar12[uVar25] = pOVar9[(int)(iVar32 * (uint)bVar3 + uVar30)];
            uVar25 = uVar25 + 1;
          } while (uVar31 != uVar25);
        }
      }
      uVar25 = (ulong)(uVar30 + 1 & 0xffff);
    } while ((ushort)(uVar30 + 1) < (ushort)bVar3);
  }
  goto LAB_0011cd1c;
}

Assistant:

static OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,
                                   opj_jp2_color_t *color,
                                   opj_event_mgr_t * p_manager)
{
    opj_image_comp_t *old_comps, *new_comps;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    opj_jp2_cmap_comp_t *cmap;
    OPJ_INT32 *src, *dst;
    OPJ_UINT32 j, max;
    OPJ_UINT16 i, nr_channels, cmp, pcol;
    OPJ_INT32 k, top_k;

    channel_size = color->jp2_pclr->channel_size;
    channel_sign = color->jp2_pclr->channel_sign;
    entries = color->jp2_pclr->entries;
    cmap = color->jp2_pclr->cmap;
    nr_channels = color->jp2_pclr->nr_channels;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        if (image->comps[cmp].data == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n", i);
            return OPJ_FALSE;
        }
    }

    old_comps = image->comps;
    new_comps = (opj_image_comp_t*)
                opj_malloc(nr_channels * sizeof(opj_image_comp_t));
    if (!new_comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Memory allocation failure in opj_jp2_apply_pclr().\n");
        return OPJ_FALSE;
    }
    for (i = 0; i < nr_channels; ++i) {
        pcol = cmap[i].pcol;
        cmp = cmap[i].cmp;

        /* Direct use */
        if (cmap[i].mtyp == 0) {
            assert(pcol == 0);
            new_comps[i] = old_comps[cmp];
        } else {
            assert(i == pcol);
            new_comps[pcol] = old_comps[cmp];
        }

        /* Palette mapping: */
        new_comps[i].data = (OPJ_INT32*)
                            opj_image_data_alloc(sizeof(OPJ_INT32) * old_comps[cmp].w * old_comps[cmp].h);
        if (!new_comps[i].data) {
            while (i > 0) {
                -- i;
                opj_image_data_free(new_comps[i].data);
            }
            opj_free(new_comps);
            opj_event_msg(p_manager, EVT_ERROR,
                          "Memory allocation failure in opj_jp2_apply_pclr().\n");
            return OPJ_FALSE;
        }
        new_comps[i].prec = channel_size[i];
        new_comps[i].sgnd = channel_sign[i];
    }

    top_k = color->jp2_pclr->nr_entries - 1;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        pcol = cmap[i].pcol;
        src = old_comps[cmp].data;
        assert(src); /* verified above */
        max = new_comps[pcol].w * new_comps[pcol].h;

        /* Direct use: */
        if (cmap[i].mtyp == 0) {
            dst = new_comps[i].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                dst[j] = src[j];
            }
        } else {
            assert(i == pcol);
            dst = new_comps[pcol].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                /* The index */
                if ((k = src[j]) < 0) {
                    k = 0;
                } else if (k > top_k) {
                    k = top_k;
                }

                /* The colour */
                dst[j] = (OPJ_INT32)entries[k * nr_channels + pcol];
            }
        }
    }

    max = image->numcomps;
    for (i = 0; i < max; ++i) {
        if (old_comps[i].data) {
            opj_image_data_free(old_comps[i].data);
        }
    }

    opj_free(old_comps);
    image->comps = new_comps;
    image->numcomps = nr_channels;

    return OPJ_TRUE;
}